

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall
Stack2_advanced_Move_Test::~Stack2_advanced_Move_Test(Stack2_advanced_Move_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Stack2_advanced, Move) {
	SimpleStack<int> s;
	s.push(1234);
	Stack<SimpleStack<int>> r(std::move(s));
	Stack<SimpleStack<int>> p(std::move(r));
	EXPECT_TRUE(!r);
	EXPECT_EQ(p.head().head(),1234);
	r = std::move(p);
	EXPECT_TRUE(!p);
	EXPECT_EQ(r.head().head(), 1234);
}